

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  undefined1 uVar2;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  key_type *key;
  AssertHelper *this_01;
  key_type expression_text;
  key_type actual_predicate_value;
  char *expected_predicate_value;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  type in_stack_ffffffffffffe0f8;
  type __p;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe100;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  uint *in_stack_ffffffffffffe108;
  char **lhs;
  int index;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe110;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  undefined4 in_stack_ffffffffffffe118;
  undefined4 uVar3;
  int in_stack_ffffffffffffe11c;
  int iVar4;
  char *in_stack_ffffffffffffe120;
  char *file;
  Type in_stack_ffffffffffffe12c;
  Type type;
  AssertHelper *in_stack_ffffffffffffe130;
  AssertHelper *this_04;
  undefined8 in_stack_ffffffffffffe148;
  nonempty_iterator in_stack_ffffffffffffe150;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe158;
  char *in_stack_ffffffffffffe160;
  char *in_stack_ffffffffffffe168;
  char *in_stack_ffffffffffffe170;
  AssertionResult *in_stack_ffffffffffffe178;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_ffffffffffffe180;
  key_type *in_stack_ffffffffffffe198;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe1a0;
  value_type *in_stack_ffffffffffffe238;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffe240;
  key_type *in_stack_ffffffffffffe318;
  key_type *key_00;
  undefined7 in_stack_ffffffffffffe320;
  undefined1 in_stack_ffffffffffffe327;
  string local_1bb0 [55];
  undefined1 local_1b79;
  AssertionResult local_1b78;
  key_type local_1b68;
  key_type local_1ab0;
  char *local_1aa8;
  undefined4 local_1a9c;
  AssertionResult local_1a98;
  string local_1a88 [128];
  key_type local_1a08;
  undefined1 local_19a9;
  AssertionResult local_19a8;
  string local_1998 [55];
  undefined1 local_1961;
  AssertionResult local_1960;
  key_type local_1950;
  key_type local_1898;
  key_type *local_1890;
  undefined4 local_1884;
  AssertionResult local_1880;
  string local_1870 [128];
  key_type local_17f0;
  undefined1 local_1791;
  AssertionResult local_1790;
  string local_1780 [55];
  undefined1 local_1749;
  AssertionResult local_1748;
  key_type local_1738;
  key_type local_1680;
  size_type local_1678;
  undefined4 local_166c;
  AssertionResult local_1668;
  string local_1658 [128];
  key_type local_15d8;
  undefined1 local_1579;
  AssertionResult local_1578;
  string local_1568 [55];
  undefined1 local_1531;
  AssertionResult local_1530;
  key_type local_1520;
  key_type local_1468;
  size_type local_1460;
  undefined4 local_1454;
  AssertionResult local_1450;
  string local_1440 [128];
  key_type local_13c0;
  undefined1 local_1361;
  AssertionResult local_1360;
  string local_1350 [55];
  undefined1 local_1319;
  AssertionResult local_1318 [2];
  key_type local_12f8;
  key_type local_12f0;
  AssertionResult local_12e8;
  string local_12d8 [55];
  undefined1 local_12a1;
  AssertionResult local_12a0;
  key_type local_1290;
  key_type local_11d8;
  size_type local_11d0;
  undefined4 local_11c4;
  AssertionResult local_11c0;
  string local_11b0 [128];
  key_type local_1130;
  undefined1 local_10d1;
  AssertionResult local_10d0;
  string local_10c0 [55];
  undefined1 local_1089;
  AssertionResult local_1088 [2];
  key_type local_1068;
  key_type local_1060;
  AssertionResult local_1058;
  string local_1048 [55];
  undefined1 local_1011;
  AssertionResult local_1010;
  key_type local_1000;
  key_type local_f48;
  size_type local_f40;
  undefined4 local_f34;
  AssertionResult local_f30;
  string local_f20 [128];
  key_type local_ea0;
  undefined1 local_e41;
  AssertionResult local_e40;
  string local_e30 [55];
  undefined1 local_df9;
  AssertionResult local_df8 [2];
  key_type local_dd8;
  key_type local_dd0;
  AssertionResult local_dc8;
  string local_db8 [55];
  undefined1 local_d81;
  AssertionResult local_d80;
  key_type local_d70;
  key_type local_cb8;
  size_type local_cb0;
  undefined4 local_ca4;
  AssertionResult local_ca0;
  string local_c90 [128];
  key_type local_c10;
  undefined1 local_bb1;
  AssertionResult local_bb0;
  string local_ba0 [55];
  undefined1 local_b69;
  AssertionResult local_b68 [2];
  key_type local_b48;
  key_type local_b40;
  AssertionResult local_b38;
  string local_b28 [55];
  undefined1 local_af1;
  AssertionResult local_af0;
  key_type local_ae0;
  key_type local_a28;
  size_type local_a20;
  undefined4 local_a14;
  AssertionResult local_a10;
  string local_a00 [128];
  key_type local_980;
  undefined1 local_921;
  AssertionResult local_920 [12];
  key_type local_858;
  key_type local_850;
  AssertionResult local_848;
  key_type local_838;
  type local_830;
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_828;
  char **local_820;
  HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_818;
  undefined8 local_810;
  char *pcStack_808;
  undefined8 local_800;
  AssertHelper *pAStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  size_type local_780;
  undefined4 local_774;
  AssertionResult local_770 [6];
  value_type local_708;
  value_type local_6a8;
  value_type local_648;
  value_type local_5e8;
  value_type local_588;
  value_type local_528;
  value_type local_4c8;
  value_type local_468;
  string local_460 [55];
  byte local_429;
  AssertionResult local_428 [6];
  value_type local_3c0;
  string local_3b8 [55];
  undefined1 local_381;
  AssertionResult local_380;
  key_type local_370;
  key_type local_2b8;
  size_type local_2b0;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  string local_290 [128];
  key_type local_210;
  undefined1 local_1b1;
  AssertionResult local_1b0;
  string local_1a0 [71];
  undefined1 local_159;
  AssertionResult local_158;
  key_type local_148 [20];
  AssertionResult local_a8 [10];
  
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)in_stack_ffffffffffffe100);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)in_stack_ffffffffffffe100);
  local_159 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::empty((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xd6d3ba);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe100,(bool *)in_stack_ffffffffffffe0f8,
             (type *)0xd6d3dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe130,in_stack_ffffffffffffe12c,in_stack_ffffffffffffe120,
               in_stack_ffffffffffffe11c,(char *)in_stack_ffffffffffffe110);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe100);
    std::__cxx11::string::~string(local_1a0);
    testing::Message::~Message((Message *)0xd6d49d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6d534);
  local_210 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe110,(int)((ulong)in_stack_ffffffffffffe108 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_1b1 = google::
              sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffe100,(iterator *)in_stack_ffffffffffffe0f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe100,(bool *)in_stack_ffffffffffffe0f8,
             (type *)0xd6d5ca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe130,in_stack_ffffffffffffe12c,in_stack_ffffffffffffe120,
               in_stack_ffffffffffffe11c,(char *)in_stack_ffffffffffffe110);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe100);
    std::__cxx11::string::~string(local_290);
    testing::Message::~Message((Message *)0xd6d69d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6d734);
  local_2a4 = 0;
  local_2b8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe110,(int)((ulong)in_stack_ffffffffffffe108 >> 0x20))
  ;
  local_2b0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_ffffffffffffe100,(key_type *)in_stack_ffffffffffffe0f8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe11c,in_stack_ffffffffffffe118),
             (char *)in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,
             (unsigned_long *)in_stack_ffffffffffffe100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe130);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6d7f6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe130,in_stack_ffffffffffffe12c,in_stack_ffffffffffffe120,
               in_stack_ffffffffffffe11c,(char *)in_stack_ffffffffffffe110);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe100);
    testing::Message::~Message((Message *)0xd6d859);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6d8ca);
  local_370 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe110,(int)((ulong)in_stack_ffffffffffffe108 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe327,in_stack_ffffffffffffe320),
                in_stack_ffffffffffffe318);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)in_stack_ffffffffffffe100,in_stack_ffffffffffffe0f8);
  local_381 = google::
              sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_ffffffffffffe100,(iterator *)in_stack_ffffffffffffe0f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe100,(bool *)in_stack_ffffffffffffe0f8,
             (type *)0xd6d960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe130,in_stack_ffffffffffffe12c,in_stack_ffffffffffffe120,
               in_stack_ffffffffffffe11c,(char *)in_stack_ffffffffffffe110);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe100);
    std::__cxx11::string::~string(local_3b8);
    testing::Message::~Message((Message *)0xd6da33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6daca);
  local_3c0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,
                             (int)((ulong)in_stack_ffffffffffffe0f8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xd6db21);
  local_429 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffe100,(bool *)in_stack_ffffffffffffe0f8,
             (type *)0xd6db45);
  iVar4 = (int)((ulong)in_stack_ffffffffffffe0f8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe130,in_stack_ffffffffffffe12c,in_stack_ffffffffffffe120,
               in_stack_ffffffffffffe11c,(char *)in_stack_ffffffffffffe110);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe100);
    std::__cxx11::string::~string(local_460);
    testing::Message::~Message((Message *)0xd6dc18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6dcaf);
  local_468 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_4c8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_528 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_588 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_5e8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_648 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_6a8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_708 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffe100,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffe240,in_stack_ffffffffffffe238);
  local_774 = 9;
  local_780 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd6defb);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffe11c,in_stack_ffffffffffffe118),
             (char *)in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,
             (unsigned_long *)in_stack_ffffffffffffe100);
  iVar4 = (int)((ulong)in_stack_ffffffffffffe108 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_770);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffe130);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6df74);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffe130,in_stack_ffffffffffffe12c,in_stack_ffffffffffffe120,
               in_stack_ffffffffffffe11c,(char *)in_stack_ffffffffffffe110);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffe100);
    testing::Message::~Message((Message *)0xd6dfd7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6e048);
  local_838 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffe110,iVar4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  type = (Type)((ulong)local_800 >> 0x20);
  uVar3 = (undefined4)local_810;
  iVar4 = (int)((ulong)local_810 >> 0x20);
  it_00.super_iterator.pos.row_begin._M_current._0_4_ = uVar3;
  it_00.super_iterator.ht =
       (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)pHStack_818;
  it_00.super_iterator.pos.row_begin._M_current._4_4_ = iVar4;
  it_00.super_iterator.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_808;
  it_00.super_iterator.pos.row_current._M_current._0_4_ = (int)local_800;
  it_00.super_iterator.pos.row_current._M_current._4_4_ = type;
  it_00.super_iterator.pos.col_current = (nonempty_iterator)pAStack_7f8;
  it_00.super_iterator.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_7f0;
  it_00.super_iterator.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_7e8;
  it_00.super_iterator.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_ffffffffffffe148;
  it_00.super_iterator.end.col_current = in_stack_ffffffffffffe150;
  it_00.parent_ = in_stack_ffffffffffffe158;
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator((const_iterator *)pBStack_828,it_00);
  local_850 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd6e0e6);
  local_858 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(pHStack_818,(int)((ulong)local_820 >> 0x20));
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)pHStack_818,local_820,(char **)pBStack_828);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_848);
  __p = local_830;
  this_02 = pBStack_828;
  lhs = local_820;
  this_03 = pHStack_818;
  file = pcStack_808;
  this_04 = pAStack_7f8;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_7f8);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6e179);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_7f8,type,pcStack_808,iVar4,(char *)pHStack_818);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pBStack_828);
    testing::Message::~Message((Message *)0xd6e1dc);
    __p = local_830;
    this_02 = pBStack_828;
    lhs = local_820;
    this_03 = pHStack_818;
    file = pcStack_808;
    this_04 = pAStack_7f8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6e24d);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)this_02,
             (HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)__p);
  local_980 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_921 = google::
              sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6e31b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_920);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_a00);
    testing::Message::~Message((Message *)0xd6e409);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6e4a0);
  local_a14 = 1;
  local_a28 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_a20 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a10);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6e588);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd6e5eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6e65c);
  local_ae0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe327,in_stack_ffffffffffffe320),
                in_stack_ffffffffffffe318);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_02,(type)__p);
  local_af1 = google::
              sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6e71a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_af0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_b28);
    testing::Message::~Message((Message *)0xd6e7ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6e886);
  local_b40 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd6e893);
  local_b48 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,lhs,(char **)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b38);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6e94c);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd6e9af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6ea1d);
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_b69 = google::
              sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6ea61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b68);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_ba0);
    testing::Message::~Message((Message *)0xd6eb36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6ebcd);
  local_c10 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_bb1 = google::
              sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6ec76);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bb0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_c90);
    testing::Message::~Message((Message *)0xd6ed4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6ede2);
  local_ca4 = 1;
  local_cb8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_cb0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ca0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6eebb);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd6ef1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6ef8f);
  local_d70 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_ffffffffffffe327,in_stack_ffffffffffffe320),
                in_stack_ffffffffffffe318);
  key_00 = local_148;
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_02,__p);
  uVar2 = google::
          sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator!=((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                        *)this_02,(const_iterator *)__p);
  local_d81 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6f03e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d80);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_db8);
    testing::Message::~Message((Message *)0xd6f113);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6f1aa);
  local_dd0 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd6f1b7);
  local_dd8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,lhs,(char **)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_dc8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6f270);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd6f2d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6f341);
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_df9 = google::
              sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6f385);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_df8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_e30);
    testing::Message::~Message((Message *)0xd6f45a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6f4f1);
  local_ea0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_e41 = google::
              sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6f5ad);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e40);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_f20);
    testing::Message::~Message((Message *)0xd6f682);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6f719);
  local_f34 = 1;
  local_f48 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_f40 = google::
              BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f30);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6f801);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd6f864);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6f8d5);
  local_1000 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe320),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_02,(type)__p);
  local_1011 = google::
               sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6f993);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1010);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1048);
    testing::Message::~Message((Message *)0xd6fa68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6faff);
  local_1060 = google::
               BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::iterator::key((iterator *)0xd6fb0c);
  local_1068 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,lhs,(char **)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1058);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd6fbc5);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd6fc28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6fc96);
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_1089 = google::
               sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6fcda);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1088);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_10c0);
    testing::Message::~Message((Message *)0xd6fdaf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd6fe46);
  local_1130 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_10d1 = google::
               sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd6feef);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10d0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_11b0);
    testing::Message::~Message((Message *)0xd6ffc4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7005b);
  local_11c4 = 1;
  local_11d8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_11d0 = google::
               BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_02,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11c0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd70134);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd70197);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd70208);
  local_1290 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe320),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_02,__p);
  local_12a1 = google::
               sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd702b7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_12a0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_12d8);
    testing::Message::~Message((Message *)0xd7038c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd70423);
  local_12f0 = google::
               BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::const_iterator::key((const_iterator *)0xd70430);
  local_12f8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,lhs,(char **)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_12e8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd704e9);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd7054c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd705ba);
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_1319 = google::
               sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd705fe);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1318);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1350);
    testing::Message::~Message((Message *)0xd706d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7076a);
  local_13c0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_1361 = google::
               sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd70814);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1360);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1440);
    testing::Message::~Message((Message *)0xd708e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd70980);
  local_1454 = 0;
  local_1468 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_1460 = google::
               BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_02,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1450);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd70a68);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd70acb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd70b3c);
  local_1520 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe320),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_02,(type)__p);
  local_1531 = google::
               sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd70be8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1530);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1568);
    testing::Message::~Message((Message *)0xd70cbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd70d54);
  local_15d8 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_1579 = google::
               sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd70deb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1578);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1658);
    testing::Message::~Message((Message *)0xd70ec0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd70f57);
  local_166c = 0;
  local_1680 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_1678 = google::
               BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_02,(key_type *)__p);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1668);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd71030);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd71093);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd71104);
  local_1738 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe320),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_02,__p);
  local_1749 = google::
               sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd711a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1748);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1780);
    testing::Message::~Message((Message *)0xd71276);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7130d);
  local_17f0 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe198);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffe1a0);
  local_1791 = google::
               sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd713b7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1790);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffe178,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1870);
    testing::Message::~Message((Message *)0xd7148c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd71523);
  local_1884 = 0;
  this_00 = (BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_1898 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  key = (key_type *)
        google::
        BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        ::count(this_02,(key_type *)__p);
  local_1890 = key;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1880);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7160b);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffe180,(Message *)in_stack_ffffffffffffe178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd7166e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd716df);
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_1950 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe320),key_00);
  assertion_result = local_a8;
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_02,(type)__p);
  local_1961 = google::
               sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd7178b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1960);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,in_stack_ffffffffffffe170,in_stack_ffffffffffffe168,
               in_stack_ffffffffffffe160);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1998);
    testing::Message::~Message((Message *)0xd71860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd718f7);
  expression_text =
       HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_1a08 = expression_text;
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(this_00,key);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_00);
  local_19a9 = google::
               sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd71988);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_19a8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,in_stack_ffffffffffffe168,in_stack_ffffffffffffe160)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1a88);
    testing::Message::~Message((Message *)0xd71a5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd71af4);
  local_1a9c = 0;
  actual_predicate_value =
       HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_1ab0 = actual_predicate_value;
  expected_predicate_value =
       (char *)google::
               BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_02,(key_type *)__p);
  local_1aa8 = expected_predicate_value;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar4,uVar3),(char *)this_03,(uint *)lhs,(unsigned_long *)this_02);
  index = (int)((ulong)lhs >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a98);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::AssertionResult::failure_message((AssertionResult *)0xd71bc1);
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd71c1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd71c8f);
  local_1b68 = HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,index);
  google::
  BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range((BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,in_stack_ffffffffffffe320),key_00);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
               *)this_02,__p);
  local_1b79 = google::
               sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_02,(const_iterator *)__p);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)__p,(type *)0xd71d20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b78);
  if (!bVar1) {
    testing::Message::Message((Message *)this_04);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_04,type,file,iVar4,(char *)this_03);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1bb0);
    testing::Message::~Message((Message *)0xd71df5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd71e89);
  google::
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xd71e96);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}